

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::anon_unknown_0::ParsingEndsInBuffer
          (anon_unknown_0 *this,char *ptr,char *end,int depth)

{
  anon_unknown_0 aVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  byte bVar4;
  int i;
  uint uVar5;
  byte unaff_BPL;
  uint uVar6;
  anon_unknown_0 *p;
  anon_unknown_0 *paVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  pair<const_char_*,_int> pVar11;
  
  uVar10 = (ulong)end & 0xffffffff;
  do {
    if (ptr <= this) {
      bVar4 = 0;
      break;
    }
    aVar1 = *this;
    p = this + 1;
    uVar5 = (uint)(byte)aVar1;
    if ((char)aVar1 < '\0') {
      uVar6 = ((uint)(byte)aVar1 + (uint)(byte)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        lVar8 = -0x15;
        paVar7 = this + 3;
        do {
          p = paVar7;
          uVar6 = ((byte)p[-1] - 1 << ((char)lVar8 + 0x23U & 0x1f)) + uVar6;
          uVar5 = uVar6;
          if (-1 < (char)p[-1]) break;
          paVar7 = p + 1;
          p = (anon_unknown_0 *)0x0;
          lVar8 = lVar8 + 7;
          uVar5 = 0;
        } while (lVar8 != 0);
      }
      else {
        p = this + 2;
        uVar5 = uVar6;
      }
    }
    if (ptr < p || p == (anon_unknown_0 *)0x0) {
switchD_0025139f_default:
      bVar3 = false;
      bVar4 = 0;
    }
    else {
      bVar4 = 1;
      if (uVar5 == 0) {
LAB_0025147c:
        bVar3 = false;
      }
      else {
        iVar9 = (int)uVar10;
        switch(uVar5 & 7) {
        case 0:
          lVar8 = 0;
          do {
            lVar8 = lVar8 + 1;
          } while (lVar8 != 10);
          if ((char)*p < '\0') {
            lVar8 = 9;
            paVar7 = p + 2;
            do {
              p = paVar7;
              if (-1 < (char)p[-1]) break;
              paVar7 = p + 1;
              p = (anon_unknown_0 *)0x0;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          else {
            p = p + 1;
          }
          bVar4 = p != (anon_unknown_0 *)0x0 & unaff_BPL;
          if (p == (anon_unknown_0 *)0x0) goto LAB_0025147c;
          break;
        case 1:
          p = p + 8;
          bVar4 = unaff_BPL;
          break;
        case 2:
          aVar1 = *p;
          if ((char)aVar1 < '\0') {
            pVar11 = ReadSizeFallback((char *)p,(uint)(byte)aVar1);
            auVar2 = pVar11._0_12_;
          }
          else {
            auVar2[8] = aVar1;
            auVar2._0_8_ = p + 1;
            auVar2._9_3_ = 0;
          }
          p = auVar2._0_8_;
          if ((p == (anon_unknown_0 *)0x0) || ((long)ptr - (long)p < (long)auVar2._8_4_)) {
            bVar3 = false;
            bVar4 = 0;
          }
          else {
            p = p + auVar2._8_4_;
            bVar3 = true;
            bVar4 = unaff_BPL;
          }
          if (!bVar3) {
            bVar3 = false;
            goto LAB_0025148d;
          }
          break;
        case 3:
          uVar10 = (ulong)(iVar9 + 1);
          bVar4 = unaff_BPL;
          break;
        case 4:
          if (iVar9 < 1) {
            bVar3 = false;
            uVar10 = (ulong)(iVar9 - 1U);
            goto LAB_0025148d;
          }
          uVar10 = (ulong)(iVar9 - 1U);
          bVar4 = unaff_BPL;
          break;
        case 5:
          p = p + 4;
          bVar4 = unaff_BPL;
          break;
        default:
          goto switchD_0025139f_default;
        }
        bVar3 = true;
      }
    }
LAB_0025148d:
    this = p;
    unaff_BPL = bVar4;
  } while (bVar3);
  return (bool)(bVar4 & 1);
}

Assistant:

bool ParsingEndsInBuffer(const char* ptr, const char* end, int depth) {
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}